

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3CreateIndex(Parse *pParse,Token *pName1,Token *pName2,SrcList *pTblName,ExprList *pList,
                       int onError,Token *pStart,Expr *pPIWhere,int sortOrder,int ifNotExist,
                       u8 idxType)

{
  sqlite3 *db_00;
  Db *pDVar1;
  i16 iVar2;
  int iVar3;
  uint uVar4;
  Pgno PVar5;
  uint uVar6;
  Table *pTVar7;
  Expr *pEVar8;
  CollSeq *pCVar9;
  void *pvVar10;
  Parse *pPVar11;
  long in_RCX;
  long in_RDX;
  char *pcVar12;
  Parse *in_RDI;
  ExprList *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  long in_stack_00000008;
  Expr *in_stack_00000010;
  int in_stack_00000018;
  Index *pNext;
  Index *pThis;
  Index **ppFrom;
  int n_1;
  int iMem;
  char *zStmt;
  Vdbe *v;
  Index *p;
  char *z2;
  char *z1;
  int k;
  Index *pIdx;
  int x;
  int nColl;
  char *zColl;
  int requestedSortOrder;
  Expr *pCExpr;
  Expr *pExpr;
  Column *pCol;
  char *zDb;
  Index *pLoop;
  int n;
  Index *pPk;
  int nExtraCol;
  int nExtra;
  ExprList_item *pListItem;
  int iDb;
  Db *pDb;
  sqlite3 *db;
  int sortOrderMask;
  int j;
  int i;
  int nName;
  char *zName;
  Index *pIndex;
  Table *pTab;
  Token prevCol;
  char *zExtra;
  Token *pName;
  DbFixer sFix;
  Parse *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  Parse *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  Parse *in_stack_fffffffffffffe48;
  sqlite3 *in_stack_fffffffffffffe50;
  Parse *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  Index **ppIVar13;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  Parse *local_190;
  char *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  Parse *in_stack_fffffffffffffea0;
  char *local_150;
  Index *pIVar14;
  Index *pIVar15;
  ExprList_item *local_100;
  int local_f4;
  byte local_e0;
  int local_dc;
  int local_d8;
  Index *local_c8;
  Table *local_c0;
  ExprList *local_b0;
  char *local_78;
  DbFixer local_68;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = (Table *)0x0;
  local_c8 = (Index *)0x0;
  memset(&local_68,0xaa,0x60);
  db_00 = in_RDI->db;
  pIVar15 = (Index *)0x0;
  if ((in_RDI->nErr == 0) &&
     ((((in_RDI->eParseMode != '\x01' || ((byte)pNext == 2)) &&
       (iVar3 = sqlite3ReadSchema((Parse *)CONCAT44(in_stack_fffffffffffffe34,
                                                    in_stack_fffffffffffffe30)), iVar3 == 0)) &&
      (iVar3 = sqlite3HasExplicitNulls
                         (in_stack_fffffffffffffe38,
                          (ExprList *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30))
      , iVar3 == 0)))) {
    if (in_RCX == 0) {
      local_c0 = in_RDI->pNewTable;
      if (local_c0 != (Table *)0x0) {
        local_f4 = sqlite3SchemaToIndex(db_00,local_c0->pSchema);
LAB_001af158:
        pDVar1 = db_00->aDb;
        iVar3 = sqlite3_strnicmp(local_c0->zName,"sqlite_",7);
        if (((iVar3 == 0) && ((db_00->init).busy == '\0')) && (in_RCX != 0)) {
          sqlite3ErrorMsg(in_RDI,"table %s may not be indexed",local_c0->zName);
        }
        else if (local_c0->eTabType == '\x02') {
          sqlite3ErrorMsg(in_RDI,"views may not be indexed");
        }
        else if (local_c0->eTabType == '\x01') {
          sqlite3ErrorMsg(in_RDI,"virtual tables may not be indexed");
        }
        else {
          uVar4 = 1;
          for (pIVar14 = local_c0->pIndex; pIVar14 != (Index *)0x0; pIVar14 = pIVar14->pNext) {
            uVar4 = uVar4 + 1;
          }
          pcVar12 = sqlite3MPrintf(db_00,"sqlite_autoindex_%s_%d",local_c0->zName,(ulong)uVar4);
          if (pcVar12 != (char *)0x0) {
            if (in_RDI->eParseMode != '\0') {
              pcVar12[7] = pcVar12[7] + '\x01';
            }
            if ((1 < in_RDI->eParseMode) ||
               ((iVar3 = sqlite3AuthCheck(in_stack_fffffffffffffe58,
                                          (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                          (char *)in_stack_fffffffffffffe48,
                                          (char *)CONCAT44(in_stack_fffffffffffffe44,
                                                           in_stack_fffffffffffffe40),
                                          (char *)in_stack_fffffffffffffe38), iVar3 == 0 &&
                (iVar3 = sqlite3AuthCheck(in_stack_fffffffffffffe58,
                                          (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                                          (char *)in_stack_fffffffffffffe48,
                                          (char *)CONCAT44(in_stack_fffffffffffffe44,
                                                           in_stack_fffffffffffffe40),
                                          (char *)in_stack_fffffffffffffe38), iVar3 == 0)))) {
              if (in_R8 == (ExprList *)0x0) {
                iVar3 = local_c0->nCol + -1;
                local_c0->aCol[iVar3].colFlags = local_c0->aCol[iVar3].colFlags | 8;
                sqlite3TokenInit((Token *)CONCAT44(in_stack_fffffffffffffe34,
                                                   in_stack_fffffffffffffe30),
                                 (char *)in_stack_fffffffffffffe28);
                in_stack_fffffffffffffe48 = in_RDI;
                sqlite3ExprAlloc(in_stack_fffffffffffffe50,(int)((ulong)in_RDI >> 0x20),
                                 (Token *)CONCAT44(in_stack_fffffffffffffe44,
                                                   in_stack_fffffffffffffe40),
                                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                local_b0 = sqlite3ExprListAppend
                                     (in_stack_fffffffffffffe38,
                                      (ExprList *)
                                      CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                                      (Expr *)in_stack_fffffffffffffe28);
                if (local_b0 != (ExprList *)0x0) {
                  sqlite3ExprListSetSortOrder(local_b0,in_stack_00000018,-1);
LAB_001af65e:
                  for (local_d8 = 0; local_d8 < local_b0->nExpr; local_d8 = local_d8 + 1) {
                    if ((local_b0->a[local_d8].pExpr)->op == 'r') {
                      sqlite3Strlen30((char *)in_stack_fffffffffffffe28);
                    }
                  }
                  iVar3 = sqlite3Strlen30((char *)in_stack_fffffffffffffe28);
                  if (pIVar15 == (Index *)0x0) {
                    in_stack_fffffffffffffe44 = 1;
                  }
                  else {
                    in_stack_fffffffffffffe44 = (uint)pIVar15->nKeyCol;
                  }
                  local_c8 = sqlite3AllocateIndexObject
                                       (in_stack_fffffffffffffe50,
                                        (i16)((ulong)in_stack_fffffffffffffe48 >> 0x30),
                                        (int)in_stack_fffffffffffffe48,
                                        (char **)CONCAT44(in_stack_fffffffffffffe44,
                                                          in_stack_fffffffffffffe40));
                  if (db_00->mallocFailed == '\0') {
                    local_c8->zName = (char *)0x0;
                    local_78 = (char *)(long)(iVar3 + 1);
                    memcpy(local_c8->zName,pcVar12,(long)(iVar3 + 1));
                    local_c8->pTable = local_c0;
                    local_c8->onError = (u8)in_R9D;
                    *(ushort *)&local_c8->field_0x63 =
                         *(ushort *)&local_c8->field_0x63 & 0xfff7 | (ushort)(in_R9D != 0) << 3;
                    *(ushort *)&local_c8->field_0x63 =
                         *(ushort *)&local_c8->field_0x63 & 0xfffc | (byte)pNext & 3;
                    local_c8->pSchema = db_00->aDb[local_f4].pSchema;
                    local_c8->nKeyCol = (u16)local_b0->nExpr;
                    if (in_stack_00000010 != (Expr *)0x0) {
                      sqlite3ResolveSelfReference
                                (in_stack_fffffffffffffe48,
                                 (Table *)CONCAT44(in_stack_fffffffffffffe44,
                                                   in_stack_fffffffffffffe40),
                                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                                 (Expr *)CONCAT44(in_stack_fffffffffffffe34,
                                                  in_stack_fffffffffffffe30),
                                 (ExprList *)in_stack_fffffffffffffe28);
                      local_c8->pPartIdxWhere = in_stack_00000010;
                    }
                    if ((pDVar1[local_f4].pSchema)->file_format < 4) {
                      local_e0 = 0;
                    }
                    else {
                      local_e0 = 0xff;
                    }
                    local_100 = local_b0->a;
                    if (1 < in_RDI->eParseMode) {
                      local_c8->aColExpr = local_b0;
                      local_b0 = (ExprList *)0x0;
                    }
                    for (local_d8 = 0; local_d8 < (int)(uint)local_c8->nKeyCol;
                        local_d8 = local_d8 + 1) {
                      sqlite3StringToId(local_100->pExpr);
                      sqlite3ResolveSelfReference
                                (in_stack_fffffffffffffe48,
                                 (Table *)CONCAT44(in_stack_fffffffffffffe44,
                                                   in_stack_fffffffffffffe40),
                                 (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                                 (Expr *)CONCAT44(in_stack_fffffffffffffe34,
                                                  in_stack_fffffffffffffe30),
                                 (ExprList *)in_stack_fffffffffffffe28);
                      if (in_RDI->nErr != 0) goto LAB_001b06c2;
                      pEVar8 = sqlite3ExprSkipCollate(local_100->pExpr);
                      if (pEVar8->op == 0xa8) {
                        local_dc = (int)pEVar8->iColumn;
                        if (local_dc < 0) {
                          local_dc = (int)local_c0->iPKey;
                        }
                        else {
                          if ((local_c0->aCol[local_dc].field_0x8 & 0xf) == 0) {
                            *(ushort *)&local_c8->field_0x63 =
                                 *(ushort *)&local_c8->field_0x63 & 0xfff7;
                          }
                          if ((local_c0->aCol[local_dc].colFlags & 0x20) != 0) {
                            *(ushort *)&local_c8->field_0x63 =
                                 *(ushort *)&local_c8->field_0x63 & 0xf7ff | 0x800;
                            *(ushort *)&local_c8->field_0x63 =
                                 *(ushort *)&local_c8->field_0x63 & 0xefff | 0x1000;
                          }
                        }
                        local_c8->aiColumn[local_d8] = (i16)local_dc;
                      }
                      else {
                        if (local_c0 == in_RDI->pNewTable) {
                          sqlite3ErrorMsg(in_RDI,
                                          "expressions prohibited in PRIMARY KEY and UNIQUE constraints"
                                         );
                          goto LAB_001b06c2;
                        }
                        if (local_c8->aColExpr == (ExprList *)0x0) {
                          local_c8->aColExpr = local_b0;
                          local_b0 = (ExprList *)0x0;
                        }
                        local_dc = -2;
                        local_c8->aiColumn[local_d8] = -2;
                        *(ushort *)&local_c8->field_0x63 = *(ushort *)&local_c8->field_0x63 & 0xfff7
                        ;
                        *(ushort *)&local_c8->field_0x63 =
                             *(ushort *)&local_c8->field_0x63 & 0xefff | 0x1000;
                      }
                      local_150 = (char *)0x0;
                      if (local_100->pExpr->op == 'r') {
                        pcVar12 = (local_100->pExpr->u).zToken;
                        iVar3 = sqlite3Strlen30((char *)in_stack_fffffffffffffe28);
                        memcpy(local_78,pcVar12,(long)(iVar3 + 1));
                        local_150 = local_78;
                        local_78 = local_78 + (iVar3 + 1);
                      }
                      else if (-1 < local_dc) {
                        local_150 = sqlite3ColumnColl(local_c0->aCol + local_dc);
                      }
                      if (local_150 == (char *)0x0) {
                        local_150 = "BINARY";
                      }
                      if (((db_00->init).busy == '\0') &&
                         (pCVar9 = sqlite3LocateCollSeq
                                             ((Parse *)CONCAT44(in_stack_fffffffffffffe44,
                                                                in_stack_fffffffffffffe40),
                                              (char *)in_stack_fffffffffffffe38),
                         pCVar9 == (CollSeq *)0x0)) goto LAB_001b06c2;
                      local_c8->azColl[local_d8] = local_150;
                      local_c8->aSortOrder[local_d8] = (local_100->fg).sortFlags & local_e0;
                      local_100 = local_100 + 1;
                    }
                    if (pIVar15 == (Index *)0x0) {
                      local_c8->aiColumn[local_d8] = -1;
                      local_c8->azColl[local_d8] = "BINARY";
                    }
                    else {
                      for (local_dc = 0; local_dc < (int)(uint)pIVar15->nKeyCol;
                          local_dc = local_dc + 1) {
                        iVar2 = pIVar15->aiColumn[local_dc];
                        iVar3 = isDupColumn((Index *)in_stack_fffffffffffffe48,
                                            in_stack_fffffffffffffe44,
                                            (Index *)in_stack_fffffffffffffe38,
                                            in_stack_fffffffffffffe34);
                        if (iVar3 == 0) {
                          local_c8->aiColumn[local_d8] = iVar2;
                          local_c8->azColl[local_d8] = pIVar15->azColl[local_dc];
                          local_c8->aSortOrder[local_d8] = pIVar15->aSortOrder[local_dc];
                          local_d8 = local_d8 + 1;
                        }
                        else {
                          local_c8->nColumn = local_c8->nColumn - 1;
                        }
                      }
                    }
                    sqlite3DefaultRowEst
                              ((Index *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40
                                                ));
                    if (in_RDI->pNewTable == (Table *)0x0) {
                      estimateIndexWidth((Index *)CONCAT44(in_stack_fffffffffffffe44,
                                                           in_stack_fffffffffffffe40));
                    }
                    recomputeColumnsNotIndexed(local_c8);
                    if ((in_RCX != 0) && ((int)local_c0->nCol <= (int)(uint)local_c8->nColumn)) {
                      *(ushort *)&local_c8->field_0x63 =
                           *(ushort *)&local_c8->field_0x63 & 0xffdf | 0x20;
                      for (local_dc = 0; local_dc < local_c0->nCol; local_dc = local_dc + 1) {
                        if ((local_dc != local_c0->iPKey) &&
                           (iVar2 = sqlite3TableColumnToIndex(local_c8,(i16)local_dc), iVar2 < 0)) {
                          *(ushort *)&local_c8->field_0x63 =
                               *(ushort *)&local_c8->field_0x63 & 0xffdf;
                          break;
                        }
                      }
                    }
                    iVar3 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
                    if (local_c0 == in_RDI->pNewTable) {
                      for (pIVar15 = local_c0->pIndex;
                          iVar3 = (int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                          pIVar15 != (Index *)0x0; pIVar15 = pIVar15->pNext) {
                        in_stack_fffffffffffffe9c = 0xaaaaaaaa;
                        if (pIVar15->nKeyCol == local_c8->nKeyCol) {
                          for (in_stack_fffffffffffffe9c = 0;
                              ((int)in_stack_fffffffffffffe9c < (int)(uint)pIVar15->nKeyCol &&
                              (in_stack_fffffffffffffe90 = &DAT_aaaaaaaaaaaaaaaa,
                              pIVar15->aiColumn[(int)in_stack_fffffffffffffe9c] ==
                              local_c8->aiColumn[(int)in_stack_fffffffffffffe9c]));
                              in_stack_fffffffffffffe9c = in_stack_fffffffffffffe9c + 1) {
                            in_stack_fffffffffffffe90 =
                                 pIVar15->azColl[(int)in_stack_fffffffffffffe9c];
                            iVar3 = sqlite3StrICmp(in_stack_fffffffffffffe90,
                                                   local_c8->azColl[(int)in_stack_fffffffffffffe9c])
                            ;
                            if (iVar3 != 0) break;
                          }
                          if (in_stack_fffffffffffffe9c == pIVar15->nKeyCol) {
                            if (pIVar15->onError != local_c8->onError) {
                              if ((pIVar15->onError != '\v') && (local_c8->onError != '\v')) {
                                sqlite3ErrorMsg(in_RDI,"conflicting ON CONFLICT clauses specified",0
                                               );
                              }
                              if (pIVar15->onError == '\v') {
                                pIVar15->onError = local_c8->onError;
                              }
                            }
                            if ((byte)pNext == 2) {
                              *(ushort *)&pIVar15->field_0x63 =
                                   *(ushort *)&pIVar15->field_0x63 & 0xfffc | 2;
                            }
                            if (1 < in_RDI->eParseMode) {
                              local_c8->pNext = in_RDI->pNewIndex;
                              in_RDI->pNewIndex = local_c8;
                              local_c8 = (Index *)0x0;
                            }
                            goto LAB_001b06c2;
                          }
                        }
                      }
                      in_stack_fffffffffffffea0 = (Parse *)0x0;
                    }
                    if (in_RDI->eParseMode < 2) {
                      if ((db_00->init).busy == '\0') {
                        if (((local_c0->tabFlags & 0x80) == 0) || (in_RCX != 0)) {
                          uVar4 = in_RDI->nMem + 1;
                          in_RDI->nMem = uVar4;
                          pPVar11 = (Parse *)sqlite3GetVdbe(in_stack_fffffffffffffe28);
                          if (pPVar11 == (Parse *)0x0) goto LAB_001b06c2;
                          sqlite3BeginWriteOperation
                                    ((Parse *)CONCAT44(in_stack_fffffffffffffe44,
                                                       in_stack_fffffffffffffe40),
                                     (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                                     (int)in_stack_fffffffffffffe38);
                          PVar5 = sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_fffffffffffffe34,
                                                                     in_stack_fffffffffffffe30),
                                                    (int)((ulong)in_stack_fffffffffffffe28 >> 0x20))
                          ;
                          local_c8->tnum = PVar5;
                          sqlite3VdbeAddOp3((Vdbe *)in_stack_fffffffffffffe48,
                                            in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                                            (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                                            (int)in_stack_fffffffffffffe38);
                          if (in_stack_00000008 == 0) {
                            local_190 = (Parse *)0x0;
                          }
                          else {
                            uVar6 = ((int)(in_RDI->sLastToken).z - (int)_NonQt) +
                                    (in_RDI->sLastToken).n;
                            if (*(char *)(_NonQt + (int)(uVar6 - 1)) == ';') {
                              uVar6 = uVar6 - 1;
                            }
                            pcVar12 = " UNIQUE";
                            if (in_R9D == 0) {
                              pcVar12 = "";
                            }
                            local_190 = (Parse *)sqlite3MPrintf(db_00,"CREATE%s INDEX %.*s",pcVar12,
                                                                (ulong)uVar6,_NonQt);
                          }
                          sqlite3NestedParse(in_RDI,
                                             "INSERT INTO %Q.sqlite_master VALUES(\'index\',%Q,%Q,#%d,%Q);"
                                             ,db_00->aDb[local_f4].zDbSName,local_c8->zName,
                                             local_c0->zName,(ulong)uVar4);
                          sqlite3DbFree((sqlite3 *)
                                        CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30
                                                ),local_190);
                          if (in_RCX != 0) {
                            sqlite3RefillIndex(in_stack_fffffffffffffea0,
                                               (Index *)CONCAT44(in_stack_fffffffffffffe9c,
                                                                 in_stack_fffffffffffffe98),iVar3);
                            sqlite3ChangeCookie((Parse *)CONCAT44(in_stack_fffffffffffffe44,
                                                                  in_stack_fffffffffffffe40),
                                                (int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
                            sqlite3MPrintf(db_00,"name=\'%q\' AND type=\'index\'",local_c8->zName);
                            sqlite3VdbeAddParseSchemaOp
                                      ((Vdbe *)CONCAT44(in_stack_fffffffffffffe44,local_f4),
                                       (int)((ulong)pPVar11 >> 0x20),
                                       (char *)CONCAT44(in_stack_fffffffffffffe34,
                                                        in_stack_fffffffffffffe30),
                                       (u16)((ulong)local_190 >> 0x30));
                            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_fffffffffffffe34,
                                                               in_stack_fffffffffffffe30),
                                              (int)((ulong)local_190 >> 0x20),(int)local_190,0);
                            in_stack_fffffffffffffe38 = pPVar11;
                            in_stack_fffffffffffffe40 = local_f4;
                          }
                          sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_fffffffffffffe34,
                                                               in_stack_fffffffffffffe30),
                                              (int)((ulong)local_190 >> 0x20));
                          in_stack_fffffffffffffe28 = local_190;
                        }
                      }
                      else {
                        if (in_RCX != 0) {
                          local_c8->tnum = (db_00->init).newTnum;
                          iVar3 = sqlite3IndexHasDuplicateRootPage(local_c8);
                          if (iVar3 != 0) {
                            sqlite3ErrorMsg(in_RDI,"invalid rootpage");
                            iVar3 = sqlite3CorruptError(0);
                            in_RDI->rc = iVar3;
                            goto LAB_001b06c2;
                          }
                        }
                        pvVar10 = sqlite3HashInsert((Hash *)CONCAT44(in_stack_fffffffffffffe6c,
                                                                     in_stack_fffffffffffffe68),
                                                    in_stack_fffffffffffffe60,
                                                    in_stack_fffffffffffffe58);
                        if (pvVar10 != (void *)0x0) {
                          sqlite3OomFault((sqlite3 *)
                                          CONCAT44(in_stack_fffffffffffffe34,
                                                   in_stack_fffffffffffffe30));
                          goto LAB_001b06c2;
                        }
                        db_00->mDbFlags = db_00->mDbFlags | 1;
                      }
                    }
                    if (((db_00->init).busy == '\0') && (in_RCX != 0)) {
                      if (1 < in_RDI->eParseMode) {
                        in_RDI->pNewIndex = local_c8;
                        local_c8 = (Index *)0x0;
                      }
                    }
                    else {
                      local_c8->pNext = local_c0->pIndex;
                      local_c0->pIndex = local_c8;
                      local_c8 = (Index *)0x0;
                    }
                  }
                }
              }
              else {
                sqlite3ExprListCheckLength
                          ((Parse *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           (ExprList *)in_stack_fffffffffffffe38,
                           (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
                local_b0 = in_R8;
                if (in_RDI->nErr == 0) goto LAB_001af65e;
              }
            }
          }
        }
      }
    }
    else {
      local_f4 = sqlite3TwoPartName(in_stack_fffffffffffffe48,
                                    (Token *)CONCAT44(in_stack_fffffffffffffe44,
                                                      in_stack_fffffffffffffe40),
                                    (Token *)in_stack_fffffffffffffe38,
                                    (Token **)
                                    CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      if (-1 < local_f4) {
        if ((((db_00->init).busy == '\0') &&
            (pTVar7 = sqlite3SrcListLookup
                                ((Parse *)CONCAT44(in_stack_fffffffffffffe44,
                                                   in_stack_fffffffffffffe40),
                                 (SrcList *)in_stack_fffffffffffffe38), *(int *)(in_RDX + 8) == 0))
           && ((pTVar7 != (Table *)0x0 && (pTVar7->pSchema == db_00->aDb[1].pSchema)))) {
          local_f4 = 1;
        }
        sqlite3FixInit(&local_68,in_RDI,local_f4,"index",(Token *)0x0);
        sqlite3FixSrcList((DbFixer *)in_stack_fffffffffffffe38,
                          (SrcList *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        local_c0 = sqlite3LocateTableItem
                             ((Parse *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40)
                              ,(u32)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                              (SrcItem *)
                              CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
        if (local_c0 != (Table *)0x0) {
          if ((local_f4 != 1) || (db_00->aDb[1].pSchema == local_c0->pSchema)) {
            if ((local_c0->tabFlags & 0x80) != 0) {
              pIVar15 = sqlite3PrimaryKeyIndex(local_c0);
            }
            goto LAB_001af158;
          }
          sqlite3ErrorMsg(in_RDI,"cannot create a TEMP index on non-TEMP table \"%s\"",
                          local_c0->zName);
        }
      }
    }
  }
LAB_001b06c2:
  if (local_c8 != (Index *)0x0) {
    sqlite3FreeIndex((sqlite3 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                     (Index *)in_stack_fffffffffffffe28);
  }
  uVar4 = in_stack_fffffffffffffe34;
  if (local_c0 != (Table *)0x0) {
    ppIVar13 = &local_c0->pIndex;
    while (pIVar15 = *ppIVar13, pIVar15 != (Index *)0x0) {
      if (pIVar15->onError == '\x05') goto LAB_001b0758;
      ppIVar13 = &pIVar15->pNext;
    }
  }
LAB_001b07e3:
  sqlite3ExprDelete((sqlite3 *)CONCAT44(uVar4,in_stack_fffffffffffffe30),
                    (Expr *)in_stack_fffffffffffffe28);
  sqlite3ExprListDelete
            ((sqlite3 *)CONCAT44(uVar4,in_stack_fffffffffffffe30),
             (ExprList *)in_stack_fffffffffffffe28);
  sqlite3SrcListDelete
            ((sqlite3 *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
             (SrcList *)in_stack_fffffffffffffe38);
  sqlite3DbFree((sqlite3 *)CONCAT44(uVar4,in_stack_fffffffffffffe30),in_stack_fffffffffffffe28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
LAB_001b0758:
  while( true ) {
    pIVar14 = pIVar15->pNext;
    uVar4 = in_stack_fffffffffffffe34 & 0xffffff;
    if (pIVar14 != (Index *)0x0) {
      uVar4 = CONCAT13(pIVar14->onError != '\x05',(int3)in_stack_fffffffffffffe34);
    }
    if ((char)(uVar4 >> 0x18) == '\0') break;
    *ppIVar13 = pIVar14;
    pIVar15->pNext = pIVar14->pNext;
    pIVar14->pNext = pIVar15;
    ppIVar13 = &pIVar14->pNext;
    in_stack_fffffffffffffe34 = uVar4;
  }
  goto LAB_001b07e3;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateIndex(
  Parse *pParse,     /* All information about this parse */
  Token *pName1,     /* First part of index name. May be NULL */
  Token *pName2,     /* Second part of index name. May be NULL */
  SrcList *pTblName, /* Table to index. Use pParse->pNewTable if 0 */
  ExprList *pList,   /* A list of columns to be indexed */
  int onError,       /* OE_Abort, OE_Ignore, OE_Replace, or OE_None */
  Token *pStart,     /* The CREATE token that begins this statement */
  Expr *pPIWhere,    /* WHERE clause for partial indices */
  int sortOrder,     /* Sort order of primary key when pList==NULL */
  int ifNotExist,    /* Omit error if index already exists */
  u8 idxType         /* The index type */
){
  Table *pTab = 0;     /* Table to be indexed */
  Index *pIndex = 0;   /* The index to be created */
  char *zName = 0;     /* Name of the index */
  int nName;           /* Number of characters in zName */
  int i, j;
  DbFixer sFix;        /* For assigning database names to pTable */
  int sortOrderMask;   /* 1 to honor DESC in index.  0 to ignore. */
  sqlite3 *db = pParse->db;
  Db *pDb;             /* The specific table containing the indexed database */
  int iDb;             /* Index of the database that is being written */
  Token *pName = 0;    /* Unqualified name of the index to create */
  struct ExprList_item *pListItem; /* For looping over pList */
  int nExtra = 0;                  /* Space allocated for zExtra[] */
  int nExtraCol;                   /* Number of extra columns needed */
  char *zExtra = 0;                /* Extra space after the Index object */
  Index *pPk = 0;      /* PRIMARY KEY index for WITHOUT ROWID tables */

  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto exit_create_index;
  }
  assert( db->mallocFailed==0 );
  if( IN_DECLARE_VTAB && idxType!=SQLITE_IDXTYPE_PRIMARYKEY ){
    goto exit_create_index;
  }
  if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
    goto exit_create_index;
  }
  if( sqlite3HasExplicitNulls(pParse, pList) ){
    goto exit_create_index;
  }

  /*
  ** Find the table that is to be indexed.  Return early if not found.
  */
  if( pTblName!=0 ){

    /* Use the two-part index name to determine the database
    ** to search for the table. 'Fix' the table name to this db
    ** before looking up the table.
    */
    assert( pName1 && pName2 );
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) goto exit_create_index;
    assert( pName && pName->z );

#ifndef SQLITE_OMIT_TEMPDB
    /* If the index name was unqualified, check if the table
    ** is a temp table. If so, set the database to 1. Do not do this
    ** if initializing a database schema.
    */
    if( !db->init.busy ){
      pTab = sqlite3SrcListLookup(pParse, pTblName);
      if( pName2->n==0 && pTab && pTab->pSchema==db->aDb[1].pSchema ){
        iDb = 1;
      }
    }
#endif

    sqlite3FixInit(&sFix, pParse, iDb, "index", pName);
    if( sqlite3FixSrcList(&sFix, pTblName) ){
      /* Because the parser constructs pTblName from a single identifier,
      ** sqlite3FixSrcList can never fail. */
      assert(0);
    }
    pTab = sqlite3LocateTableItem(pParse, 0, &pTblName->a[0]);
    assert( db->mallocFailed==0 || pTab==0 );
    if( pTab==0 ) goto exit_create_index;
    if( iDb==1 && db->aDb[iDb].pSchema!=pTab->pSchema ){
      sqlite3ErrorMsg(pParse,
           "cannot create a TEMP index on non-TEMP table \"%s\"",
           pTab->zName);
      goto exit_create_index;
    }
    if( !HasRowid(pTab) ) pPk = sqlite3PrimaryKeyIndex(pTab);
  }else{
    assert( pName==0 );
    assert( pStart==0 );
    pTab = pParse->pNewTable;
    if( !pTab ) goto exit_create_index;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  }
  pDb = &db->aDb[iDb];

  assert( pTab!=0 );
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0
       && db->init.busy==0
       && pTblName!=0
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be indexed", pTab->zName);
    goto exit_create_index;
  }
#ifndef SQLITE_OMIT_VIEW
  if( IsView(pTab) ){
    sqlite3ErrorMsg(pParse, "views may not be indexed");
    goto exit_create_index;
  }
#endif
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "virtual tables may not be indexed");
    goto exit_create_index;
  }
#endif

  /*
  ** Find the name of the index.  Make sure there is not already another
  ** index or table with the same name.
  **
  ** Exception:  If we are reading the names of permanent indices from the
  ** sqlite_schema table (because some other process changed the schema) and
  ** one of the index names collides with the name of a temporary table or
  ** index, then we will continue to process this index.
  **
  ** If pName==0 it means that we are
  ** dealing with a primary key or UNIQUE constraint.  We have to invent our
  ** own name.
  */
  if( pName ){
    zName = sqlite3NameFromToken(db, pName);
    if( zName==0 ) goto exit_create_index;
    assert( pName->z!=0 );
    if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName,"index",pTab->zName) ){
      goto exit_create_index;
    }
    if( !IN_RENAME_OBJECT ){
      if( !db->init.busy ){
        if( sqlite3FindTable(db, zName, pDb->zDbSName)!=0 ){
          sqlite3ErrorMsg(pParse, "there is already a table named %s", zName);
          goto exit_create_index;
        }
      }
      if( sqlite3FindIndex(db, zName, pDb->zDbSName)!=0 ){
        if( !ifNotExist ){
          sqlite3ErrorMsg(pParse, "index %s already exists", zName);
        }else{
          assert( !db->init.busy );
          sqlite3CodeVerifySchema(pParse, iDb);
          sqlite3ForceNotReadOnly(pParse);
        }
        goto exit_create_index;
      }
    }
  }else{
    int n;
    Index *pLoop;
    for(pLoop=pTab->pIndex, n=1; pLoop; pLoop=pLoop->pNext, n++){}
    zName = sqlite3MPrintf(db, "sqlite_autoindex_%s_%d", pTab->zName, n);
    if( zName==0 ){
      goto exit_create_index;
    }

    /* Automatic index names generated from within sqlite3_declare_vtab()
    ** must have names that are distinct from normal automatic index names.
    ** The following statement converts "sqlite3_autoindex..." into
    ** "sqlite3_butoindex..." in order to make the names distinct.
    ** The "vtab_err.test" test demonstrates the need of this statement. */
    if( IN_SPECIAL_PARSE ) zName[7]++;
  }

  /* Check for authorization to create an index.
  */
#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    const char *zDb = pDb->zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iDb), 0, zDb) ){
      goto exit_create_index;
    }
    i = SQLITE_CREATE_INDEX;
    if( !OMIT_TEMPDB && iDb==1 ) i = SQLITE_CREATE_TEMP_INDEX;
    if( sqlite3AuthCheck(pParse, i, zName, pTab->zName, zDb) ){
      goto exit_create_index;
    }
  }
#endif

  /* If pList==0, it means this routine was called to make a primary
  ** key out of the last column added to the table under construction.
  ** So create a fake list to simulate this.
  */
  if( pList==0 ){
    Token prevCol;
    Column *pCol = &pTab->aCol[pTab->nCol-1];
    pCol->colFlags |= COLFLAG_UNIQUE;
    sqlite3TokenInit(&prevCol, pCol->zCnName);
    pList = sqlite3ExprListAppend(pParse, 0,
              sqlite3ExprAlloc(db, TK_ID, &prevCol, 0));
    if( pList==0 ) goto exit_create_index;
    assert( pList->nExpr==1 );
    sqlite3ExprListSetSortOrder(pList, sortOrder, SQLITE_SO_UNDEFINED);
  }else{
    sqlite3ExprListCheckLength(pParse, pList, "index");
    if( pParse->nErr ) goto exit_create_index;
  }

  /* Figure out how many bytes of space are required to store explicitly
  ** specified collation sequence names.
  */
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    assert( pExpr!=0 );
    if( pExpr->op==TK_COLLATE ){
      assert( !ExprHasProperty(pExpr, EP_IntValue) );
      nExtra += (1 + sqlite3Strlen30(pExpr->u.zToken));
    }
  }

  /*
  ** Allocate the index structure.
  */
  nName = sqlite3Strlen30(zName);
  nExtraCol = pPk ? pPk->nKeyCol : 1;
  assert( pList->nExpr + nExtraCol <= 32767 /* Fits in i16 */ );
  pIndex = sqlite3AllocateIndexObject(db, pList->nExpr + nExtraCol,
                                      nName + nExtra + 1, &zExtra);
  if( db->mallocFailed ){
    goto exit_create_index;
  }
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->aiRowLogEst) );
  assert( EIGHT_BYTE_ALIGNMENT(pIndex->azColl) );
  pIndex->zName = zExtra;
  zExtra += nName + 1;
  memcpy(pIndex->zName, zName, nName+1);
  pIndex->pTable = pTab;
  pIndex->onError = (u8)onError;
  pIndex->uniqNotNull = onError!=OE_None;
  pIndex->idxType = idxType;
  pIndex->pSchema = db->aDb[iDb].pSchema;
  pIndex->nKeyCol = pList->nExpr;
  if( pPIWhere ){
    sqlite3ResolveSelfReference(pParse, pTab, NC_PartIdx, pPIWhere, 0);
    pIndex->pPartIdxWhere = pPIWhere;
    pPIWhere = 0;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );

  /* Check to see if we should honor DESC requests on index columns
  */
  if( pDb->pSchema->file_format>=4 ){
    sortOrderMask = -1;   /* Honor DESC */
  }else{
    sortOrderMask = 0;    /* Ignore DESC */
  }

  /* Analyze the list of expressions that form the terms of the index and
  ** report any errors.  In the common case where the expression is exactly
  ** a table column, store that column in aiColumn[].  For general expressions,
  ** populate pIndex->aColExpr and store XN_EXPR (-2) in aiColumn[].
  **
  ** TODO: Issue a warning if two or more columns of the index are identical.
  ** TODO: Issue a warning if the table primary key is used as part of the
  ** index key.
  */
  pListItem = pList->a;
  if( IN_RENAME_OBJECT ){
    pIndex->aColExpr = pList;
    pList = 0;
  }
  for(i=0; i<pIndex->nKeyCol; i++, pListItem++){
    Expr *pCExpr;                  /* The i-th index expression */
    int requestedSortOrder;        /* ASC or DESC on the i-th expression */
    const char *zColl;             /* Collation sequence name */

    sqlite3StringToId(pListItem->pExpr);
    sqlite3ResolveSelfReference(pParse, pTab, NC_IdxExpr, pListItem->pExpr, 0);
    if( pParse->nErr ) goto exit_create_index;
    pCExpr = sqlite3ExprSkipCollate(pListItem->pExpr);
    if( pCExpr->op!=TK_COLUMN ){
      if( pTab==pParse->pNewTable ){
        sqlite3ErrorMsg(pParse, "expressions prohibited in PRIMARY KEY and "
                                "UNIQUE constraints");
        goto exit_create_index;
      }
      if( pIndex->aColExpr==0 ){
        pIndex->aColExpr = pList;
        pList = 0;
      }
      j = XN_EXPR;
      pIndex->aiColumn[i] = XN_EXPR;
      pIndex->uniqNotNull = 0;
      pIndex->bHasExpr = 1;
    }else{
      j = pCExpr->iColumn;
      assert( j<=0x7fff );
      if( j<0 ){
        j = pTab->iPKey;
      }else{
        if( pTab->aCol[j].notNull==0 ){
          pIndex->uniqNotNull = 0;
        }
        if( pTab->aCol[j].colFlags & COLFLAG_VIRTUAL ){
          pIndex->bHasVCol = 1;
          pIndex->bHasExpr = 1;
        }
      }
      pIndex->aiColumn[i] = (i16)j;
    }
    zColl = 0;
    if( pListItem->pExpr->op==TK_COLLATE ){
      int nColl;
      assert( !ExprHasProperty(pListItem->pExpr, EP_IntValue) );
      zColl = pListItem->pExpr->u.zToken;
      nColl = sqlite3Strlen30(zColl) + 1;
      assert( nExtra>=nColl );
      memcpy(zExtra, zColl, nColl);
      zColl = zExtra;
      zExtra += nColl;
      nExtra -= nColl;
    }else if( j>=0 ){
      zColl = sqlite3ColumnColl(&pTab->aCol[j]);
    }
    if( !zColl ) zColl = sqlite3StrBINARY;
    if( !db->init.busy && !sqlite3LocateCollSeq(pParse, zColl) ){
      goto exit_create_index;
    }
    pIndex->azColl[i] = zColl;
    requestedSortOrder = pListItem->fg.sortFlags & sortOrderMask;
    pIndex->aSortOrder[i] = (u8)requestedSortOrder;
  }

  /* Append the table key to the end of the index.  For WITHOUT ROWID
  ** tables (when pPk!=0) this will be the declared PRIMARY KEY.  For
  ** normal tables (when pPk==0) this will be the rowid.
  */
  if( pPk ){
    for(j=0; j<pPk->nKeyCol; j++){
      int x = pPk->aiColumn[j];
      assert( x>=0 );
      if( isDupColumn(pIndex, pIndex->nKeyCol, pPk, j) ){
        pIndex->nColumn--;
      }else{
        testcase( hasColumn(pIndex->aiColumn,pIndex->nKeyCol,x) );
        pIndex->aiColumn[i] = x;
        pIndex->azColl[i] = pPk->azColl[j];
        pIndex->aSortOrder[i] = pPk->aSortOrder[j];
        i++;
      }
    }
    assert( i==pIndex->nColumn );
  }else{
    pIndex->aiColumn[i] = XN_ROWID;
    pIndex->azColl[i] = sqlite3StrBINARY;
  }
  sqlite3DefaultRowEst(pIndex);
  if( pParse->pNewTable==0 ) estimateIndexWidth(pIndex);

  /* If this index contains every column of its table, then mark
  ** it as a covering index */
  assert( HasRowid(pTab)
      || pTab->iPKey<0 || sqlite3TableColumnToIndex(pIndex, pTab->iPKey)>=0 );
  recomputeColumnsNotIndexed(pIndex);
  if( pTblName!=0 && pIndex->nColumn>=pTab->nCol ){
    pIndex->isCovering = 1;
    for(j=0; j<pTab->nCol; j++){
      if( j==pTab->iPKey ) continue;
      if( sqlite3TableColumnToIndex(pIndex,j)>=0 ) continue;
      pIndex->isCovering = 0;
      break;
    }
  }

  if( pTab==pParse->pNewTable ){
    /* This routine has been called to create an automatic index as a
    ** result of a PRIMARY KEY or UNIQUE clause on a column definition, or
    ** a PRIMARY KEY or UNIQUE clause following the column definitions.
    ** i.e. one of:
    **
    ** CREATE TABLE t(x PRIMARY KEY, y);
    ** CREATE TABLE t(x, y, UNIQUE(x, y));
    **
    ** Either way, check to see if the table already has such an index. If
    ** so, don't bother creating this one. This only applies to
    ** automatically created indices. Users can do as they wish with
    ** explicit indices.
    **
    ** Two UNIQUE or PRIMARY KEY constraints are considered equivalent
    ** (and thus suppressing the second one) even if they have different
    ** sort orders.
    **
    ** If there are different collating sequences or if the columns of
    ** the constraint occur in different orders, then the constraints are
    ** considered distinct and both result in separate indices.
    */
    Index *pIdx;
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      int k;
      assert( IsUniqueIndex(pIdx) );
      assert( pIdx->idxType!=SQLITE_IDXTYPE_APPDEF );
      assert( IsUniqueIndex(pIndex) );

      if( pIdx->nKeyCol!=pIndex->nKeyCol ) continue;
      for(k=0; k<pIdx->nKeyCol; k++){
        const char *z1;
        const char *z2;
        assert( pIdx->aiColumn[k]>=0 );
        if( pIdx->aiColumn[k]!=pIndex->aiColumn[k] ) break;
        z1 = pIdx->azColl[k];
        z2 = pIndex->azColl[k];
        if( sqlite3StrICmp(z1, z2) ) break;
      }
      if( k==pIdx->nKeyCol ){
        if( pIdx->onError!=pIndex->onError ){
          /* This constraint creates the same index as a previous
          ** constraint specified somewhere in the CREATE TABLE statement.
          ** However the ON CONFLICT clauses are different. If both this
          ** constraint and the previous equivalent constraint have explicit
          ** ON CONFLICT clauses this is an error. Otherwise, use the
          ** explicitly specified behavior for the index.
          */
          if( !(pIdx->onError==OE_Default || pIndex->onError==OE_Default) ){
            sqlite3ErrorMsg(pParse,
                "conflicting ON CONFLICT clauses specified", 0);
          }
          if( pIdx->onError==OE_Default ){
            pIdx->onError = pIndex->onError;
          }
        }
        if( idxType==SQLITE_IDXTYPE_PRIMARYKEY ) pIdx->idxType = idxType;
        if( IN_RENAME_OBJECT ){
          pIndex->pNext = pParse->pNewIndex;
          pParse->pNewIndex = pIndex;
          pIndex = 0;
        }
        goto exit_create_index;
      }
    }
  }

  if( !IN_RENAME_OBJECT ){

    /* Link the new Index structure to its table and to the other
    ** in-memory database structures.
    */
    assert( pParse->nErr==0 );
    if( db->init.busy ){
      Index *p;
      assert( !IN_SPECIAL_PARSE );
      assert( sqlite3SchemaMutexHeld(db, 0, pIndex->pSchema) );
      if( pTblName!=0 ){
        pIndex->tnum = db->init.newTnum;
        if( sqlite3IndexHasDuplicateRootPage(pIndex) ){
          sqlite3ErrorMsg(pParse, "invalid rootpage");
          pParse->rc = SQLITE_CORRUPT_BKPT;
          goto exit_create_index;
        }
      }
      p = sqlite3HashInsert(&pIndex->pSchema->idxHash,
          pIndex->zName, pIndex);
      if( p ){
        assert( p==pIndex );  /* Malloc must have failed */
        sqlite3OomFault(db);
        goto exit_create_index;
      }
      db->mDbFlags |= DBFLAG_SchemaChange;
    }

    /* If this is the initial CREATE INDEX statement (or CREATE TABLE if the
    ** index is an implied index for a UNIQUE or PRIMARY KEY constraint) then
    ** emit code to allocate the index rootpage on disk and make an entry for
    ** the index in the sqlite_schema table and populate the index with
    ** content.  But, do not do this if we are simply reading the sqlite_schema
    ** table to parse the schema, or if this index is the PRIMARY KEY index
    ** of a WITHOUT ROWID table.
    **
    ** If pTblName==0 it means this index is generated as an implied PRIMARY KEY
    ** or UNIQUE index in a CREATE TABLE statement.  Since the table
    ** has just been created, it contains no data and the index initialization
    ** step can be skipped.
    */
    else if( HasRowid(pTab) || pTblName!=0 ){
      Vdbe *v;
      char *zStmt;
      int iMem = ++pParse->nMem;

      v = sqlite3GetVdbe(pParse);
      if( v==0 ) goto exit_create_index;

      sqlite3BeginWriteOperation(pParse, 1, iDb);

      /* Create the rootpage for the index using CreateIndex. But before
      ** doing so, code a Noop instruction and store its address in
      ** Index.tnum. This is required in case this index is actually a
      ** PRIMARY KEY and the table is actually a WITHOUT ROWID table. In
      ** that case the convertToWithoutRowidTable() routine will replace
      ** the Noop with a Goto to jump over the VDBE code generated below. */
      pIndex->tnum = (Pgno)sqlite3VdbeAddOp0(v, OP_Noop);
      sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, iMem, BTREE_BLOBKEY);

      /* Gather the complete text of the CREATE INDEX statement into
      ** the zStmt variable
      */
      assert( pName!=0 || pStart==0 );
      if( pStart ){
        int n = (int)(pParse->sLastToken.z - pName->z) + pParse->sLastToken.n;
        if( pName->z[n-1]==';' ) n--;
        /* A named index with an explicit CREATE INDEX statement */
        zStmt = sqlite3MPrintf(db, "CREATE%s INDEX %.*s",
            onError==OE_None ? "" : " UNIQUE", n, pName->z);
      }else{
        /* An automatic index created by a PRIMARY KEY or UNIQUE constraint */
        /* zStmt = sqlite3MPrintf(""); */
        zStmt = 0;
      }

      /* Add an entry in sqlite_schema for this index
      */
      sqlite3NestedParse(pParse,
         "INSERT INTO %Q." LEGACY_SCHEMA_TABLE " VALUES('index',%Q,%Q,#%d,%Q);",
         db->aDb[iDb].zDbSName,
         pIndex->zName,
         pTab->zName,
         iMem,
         zStmt
      );
      sqlite3DbFree(db, zStmt);

      /* Fill the index with data and reparse the schema. Code an OP_Expire
      ** to invalidate all pre-compiled statements.
      */
      if( pTblName ){
        sqlite3RefillIndex(pParse, pIndex, iMem);
        sqlite3ChangeCookie(pParse, iDb);
        sqlite3VdbeAddParseSchemaOp(v, iDb,
            sqlite3MPrintf(db, "name='%q' AND type='index'", pIndex->zName), 0);
        sqlite3VdbeAddOp2(v, OP_Expire, 0, 1);
      }

      sqlite3VdbeJumpHere(v, (int)pIndex->tnum);
    }
  }
  if( db->init.busy || pTblName==0 ){
    pIndex->pNext = pTab->pIndex;
    pTab->pIndex = pIndex;
    pIndex = 0;
  }
  else if( IN_RENAME_OBJECT ){
    assert( pParse->pNewIndex==0 );
    pParse->pNewIndex = pIndex;
    pIndex = 0;
  }

  /* Clean up before exiting */
exit_create_index:
  if( pIndex ) sqlite3FreeIndex(db, pIndex);
  if( pTab ){
    /* Ensure all REPLACE indexes on pTab are at the end of the pIndex list.
    ** The list was already ordered when this routine was entered, so at this
    ** point at most a single index (the newly added index) will be out of
    ** order.  So we have to reorder at most one index. */
    Index **ppFrom;
    Index *pThis;
    for(ppFrom=&pTab->pIndex; (pThis = *ppFrom)!=0; ppFrom=&pThis->pNext){
      Index *pNext;
      if( pThis->onError!=OE_Replace ) continue;
      while( (pNext = pThis->pNext)!=0 && pNext->onError!=OE_Replace ){
        *ppFrom = pNext;
        pThis->pNext = pNext->pNext;
        pNext->pNext = pThis;
        ppFrom = &pNext->pNext;
      }
      break;
    }
#ifdef SQLITE_DEBUG
    /* Verify that all REPLACE indexes really are now at the end
    ** of the index list.  In other words, no other index type ever
    ** comes after a REPLACE index on the list. */
    for(pThis = pTab->pIndex; pThis; pThis=pThis->pNext){
      assert( pThis->onError!=OE_Replace
           || pThis->pNext==0
           || pThis->pNext->onError==OE_Replace );
    }
#endif
  }
  sqlite3ExprDelete(db, pPIWhere);
  sqlite3ExprListDelete(db, pList);
  sqlite3SrcListDelete(db, pTblName);
  sqlite3DbFree(db, zName);
}